

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O0

nk_color nk_rgb(int r,int g,int b)

{
  undefined4 local_34;
  undefined1 local_30;
  undefined4 local_2c;
  undefined4 local_28;
  undefined1 local_24;
  undefined4 local_20;
  undefined4 local_1c;
  undefined1 local_18;
  undefined4 local_14;
  int b_local;
  int g_local;
  int r_local;
  nk_color ret;
  
  local_14 = r;
  if (0xfe < r) {
    local_14 = 0xff;
  }
  if (local_14 < 0) {
    local_18 = 0;
  }
  else {
    local_1c = r;
    if (0xfe < r) {
      local_1c = 0xff;
    }
    local_18 = (undefined1)local_1c;
  }
  local_20 = g;
  if (0xfe < g) {
    local_20 = 0xff;
  }
  if (local_20 < 0) {
    local_24 = 0;
  }
  else {
    local_28 = g;
    if (0xfe < g) {
      local_28 = 0xff;
    }
    local_24 = (undefined1)local_28;
  }
  ret.g = local_24;
  ret.r = local_18;
  local_2c = b;
  if (0xfe < b) {
    local_2c = 0xff;
  }
  if (local_2c < 0) {
    local_30 = 0;
  }
  else {
    local_34 = b;
    if (0xfe < b) {
      local_34 = 0xff;
    }
    local_30 = (undefined1)local_34;
  }
  ret.b = local_30;
  ret.a = 0xff;
  return ret;
}

Assistant:

NK_API struct nk_color
nk_rgb(int r, int g, int b)
{
struct nk_color ret;
ret.r = (nk_byte)NK_CLAMP(0, r, 255);
ret.g = (nk_byte)NK_CLAMP(0, g, 255);
ret.b = (nk_byte)NK_CLAMP(0, b, 255);
ret.a = (nk_byte)255;
return ret;
}